

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O2

void __thiscall nuraft::buffer_serializer::put_raw(buffer_serializer *this,void *raw_ptr,size_t len)

{
  bool bVar1;
  void *__dest;
  overflow_error *this_00;
  
  bVar1 = is_valid(this,len);
  if (bVar1) {
    __dest = data(this);
    memcpy(__dest,raw_ptr,len);
    pos(this,len + this->pos_);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_raw(const void* raw_ptr, size_t len) {
    if ( !is_valid(len) ) throw std::overflow_error("not enough space");
    memcpy(data(), raw_ptr, len);
    pos( pos() + len );
}